

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

void __thiscall
Semantic::Err::UndeclaredFunction::UndeclaredFunction
          (UndeclaredFunction *this,string *funcName,int position)

{
  this->super_Error = (Error)&PTR__UndeclaredFunction_0014c398;
  (this->funcName)._M_dataplus._M_p = (pointer)&(this->funcName).field_2;
  (this->funcName)._M_string_length = 0;
  (this->funcName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->funcName);
  this->position = position;
  return;
}

Assistant:

UndeclaredFunction(std::string funcName, int position) : Error() {
                this->funcName = funcName;
                this->position = position;
            }